

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O0

void __thiscall Maze::Maze(Maze *this,string *inputFileName)

{
  byte bVar1;
  bool bVar2;
  ostream *this_00;
  istream *piVar3;
  ulong uVar4;
  value_type *__x;
  int local_8c;
  undefined1 local_88 [4];
  int i;
  vector<bool,_std::allocator<bool>_> usedRow;
  vector<char,_std::allocator<char>_> Row;
  string tempRow;
  string *inputFileName_local;
  Maze *this_local;
  
  std::
  stack<std::tuple<int,int>,std::deque<std::tuple<int,int>,std::allocator<std::tuple<int,int>>>>::
  stack<std::deque<std::tuple<int,int>,std::allocator<std::tuple<int,int>>>,void>
            ((stack<std::tuple<int,int>,std::deque<std::tuple<int,int>,std::allocator<std::tuple<int,int>>>>
              *)this);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(&this->MazeMatrix);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(&this->solvedMatrix);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector(&this->used);
  std::tuple<int,_int>::tuple<true,_true>(&this->startCell);
  std::tuple<int,_int>::tuple<true,_true>(&this->endCell);
  std::ifstream::ifstream(&this->MazeStream);
  std::ifstream::open(&this->MazeStream,inputFileName,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_00 = std::operator<<((ostream *)&std::cout,"Could not open file");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::__cxx11::string::string
              ((string *)&Row.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&this->MazeStream,
                          (string *)
                          &Row.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)
                 &usedRow.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_88);
      local_8c = 0;
      while( true ) {
        uVar4 = std::__cxx11::string::size();
        if (uVar4 <= (ulong)(long)local_8c) break;
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)local_88,false);
        __x = (value_type *)
              std::__cxx11::string::at
                        ((ulong)&Row.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 field_0x10);
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)
                   &usedRow.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage,__x);
        local_8c = local_8c + 1;
      }
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::push_back(&this->MazeMatrix,
                  (value_type *)
                  &usedRow.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::push_back(&this->solvedMatrix,
                  (value_type *)
                  &usedRow.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::push_back(&this->used,(value_type *)local_88);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_88);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)
                 &usedRow.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage);
    }
    this->isSolved = false;
    std::ifstream::close();
    std::__cxx11::string::~string
              ((string *)&Row.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  }
  return;
}

Assistant:

Maze::Maze(std::string inputFileName) {
    //constructs the maze, and the solved mazed.
    MazeStream.open(inputFileName);
    if (!MazeStream.is_open())  {
        std::cout<< "Could not open file" << std::endl;
        return;
    }
    std::string tempRow;
    while (getline(MazeStream, tempRow)){
        std::vector<char> Row;
        std::vector<bool> usedRow;
        for(int i = 0; i<tempRow.size(); i++)
        {
            usedRow.push_back(false);
            Row.push_back(tempRow.at(i));
        }
        MazeMatrix.push_back(Row);
        //the solution
        solvedMatrix.push_back(Row);
        used.push_back(usedRow);
    }
    isSolved = false;
    MazeStream.close();
}